

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::
Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::registerNew(Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uniqKey,
             Logger *ptr)

{
  int iVar1;
  undefined4 extraout_var;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>
  local_48;
  Logger *local_20;
  Logger *ptr_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uniqKey_local;
  Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = ptr;
  ptr_local = (Logger *)uniqKey;
  uniqKey_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  unregister(this,uniqKey);
  iVar1 = (*(this->
            super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
            ).super_ThreadSafe._vptr_ThreadSafe[0xb])();
  ::std::make_pair<std::__cxx11::string_const&,el::Logger*&>
            (&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ptr_local,
             &local_20);
  ::std::
  unordered_map<std::__cxx11::string,el::Logger*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,el::Logger*>>>
  ::insert<std::pair<std::__cxx11::string,el::Logger*>>
            ((unordered_map<std::__cxx11::string,el::Logger*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,el::Logger*>>>
              *)CONCAT44(extraout_var,iVar1),&local_48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>
  ::~pair(&local_48);
  return;
}

Assistant:

virtual void registerNew(const T_Key& uniqKey, T_Ptr* ptr) ELPP_FINAL {
    unregister(uniqKey);
    this->list().insert(std::make_pair(uniqKey, ptr));
  }